

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom(AnyMetadata *this,Message *message)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"type.googleapis.com/",&local_39);
  PackFrom(this,message,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message) {
  PackFrom(message, kTypeGoogleApisComPrefix);
}